

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

void __thiscall tinyusdz::Prim::Prim(Prim *this,string *elementPath,Value *rhs)

{
  _Rb_tree_header *p_Var1;
  vtable_type *pvVar2;
  uint32_t uVar3;
  allocator local_121;
  string local_120;
  Path local_100;
  
  Path::Path(&this->_abs_path);
  Path::Path(&this->_path);
  Path::Path(&this->_elementPath);
  (this->_prim_type_name)._M_dataplus._M_p = (pointer)&(this->_prim_type_name).field_2;
  (this->_prim_type_name)._M_string_length = 0;
  (this->_prim_type_name).field_2._M_local_buf[0] = '\0';
  this->_specifier = Invalid;
  (this->_data).v_.vtable = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  (this->_data).v_.storage.dynamic = (void *)0x0;
  (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header;
  (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_child_dirty = false;
  this->_primChildrenIndicesIsValid = false;
  (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_prim_id = -1;
  p_Var1 = &(this->_variantSets)._M_t._M_impl.super__Rb_tree_header;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar2 = (rhs->v_).vtable;
  if ((pvVar2 != (vtable_type *)0x0) && (uVar3 = (*pvVar2->type_id)(), 0x3ff < uVar3)) {
    pvVar2 = (rhs->v_).vtable;
    if ((pvVar2 != (vtable_type *)0x0) && (uVar3 = (*pvVar2->type_id)(), 0x2005 < uVar3)) {
      return;
    }
    ::std::__cxx11::string::string((string *)&local_120,"",&local_121);
    Path::Path(&local_100,elementPath,&local_120);
    Path::operator=(&this->_path,&local_100);
    Path::~Path(&local_100);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::string((string *)&local_120,"",&local_121);
    Path::Path(&local_100,elementPath,&local_120);
    Path::operator=(&this->_elementPath,&local_100);
    Path::~Path(&local_100);
    ::std::__cxx11::string::_M_dispose();
    linb::any::operator=(&(this->_data).v_,&rhs->v_);
    SetPrimElementName(&this->_data,elementPath);
  }
  return;
}

Assistant:

Prim::Prim(const std::string &elementPath, value::Value &&rhs) {
  // Check if type is Prim(Model(GPrim), usdShade, usdLux, etc.)
  if ((value::TypeId::TYPE_ID_MODEL_BEGIN <= rhs.type_id()) &&
      (value::TypeId::TYPE_ID_MODEL_END > rhs.type_id())) {
    _path = Path(elementPath, /* prop part */ "");
    _elementPath = Path(elementPath, /* prop part */ "");

    _data = std::move(rhs);
    SetPrimElementName(_data, elementPath);
  } else {
    // TODO: Raise an error if rhs is not an Prim
  }
}